

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubdirCommand.cxx
# Opt level: O2

bool __thiscall
cmSubdirCommand::InitialPass
          (cmSubdirCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  bool bVar2;
  bool excludeFromAll;
  bool bVar3;
  string *psVar4;
  pointer __lhs;
  string binPath;
  string srcPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__lhs == pbVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"called with incorrect number of arguments",
               (allocator<char> *)&local_b0);
    cmCommand::SetError(&this->super_cmCommand,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    bVar3 = false;
  }
  else {
    bVar3 = true;
    excludeFromAll = false;
    for (; __lhs != pbVar1; __lhs = __lhs + 1) {
      bVar2 = std::operator==(__lhs,"EXCLUDE_FROM_ALL");
      if (bVar2) {
        excludeFromAll = true;
      }
      else {
        bVar2 = std::operator==(__lhs,"PREORDER");
        if (!bVar2) {
          psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                             ((this->super_cmCommand).Makefile);
          std::operator+(&local_b0,psVar4,"/");
          std::operator+(&local_90,&local_b0,__lhs);
          std::__cxx11::string::~string((string *)&local_b0);
          bVar2 = cmsys::SystemTools::FileIsDirectory(&local_90);
          if (bVar2) {
            psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                               ((this->super_cmCommand).Makefile);
            std::operator+(&local_70,psVar4,"/");
            std::operator+(&local_b0,&local_70,__lhs);
            std::__cxx11::string::~string((string *)&local_70);
            cmMakefile::AddSubDirectory
                      ((this->super_cmCommand).Makefile,&local_90,&local_b0,excludeFromAll,false);
LAB_00235cfa:
            std::__cxx11::string::~string((string *)&local_b0);
          }
          else {
            bVar2 = cmsys::SystemTools::FileIsDirectory(__lhs);
            if (bVar2) {
              psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                                 ((this->super_cmCommand).Makefile);
              std::operator+(&local_70,psVar4,"/");
              cmsys::SystemTools::GetFilenameName(&local_50,__lhs);
              std::operator+(&local_b0,&local_70,&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_70);
              cmMakefile::AddSubDirectory
                        ((this->super_cmCommand).Makefile,__lhs,&local_b0,excludeFromAll,false);
              goto LAB_00235cfa;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b0,"Incorrect SUBDIRS command. Directory: ",
                       (allocator<char> *)&local_70);
            std::operator+(&local_70,__lhs," does not exist.");
            std::__cxx11::string::append((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_70);
            cmCommand::SetError(&this->super_cmCommand,&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
            bVar3 = false;
          }
          std::__cxx11::string::~string((string *)&local_90);
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool cmSubdirCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  bool res = true;
  bool excludeFromAll = false;

  for (std::string const& i : args) {
    if (i == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (i == "PREORDER") {
      // Ignored
      continue;
    }

    // if they specified a relative path then compute the full
    std::string srcPath =
      this->Makefile->GetCurrentSourceDirectory() + "/" + i;
    if (cmSystemTools::FileIsDirectory(srcPath)) {
      std::string binPath =
        this->Makefile->GetCurrentBinaryDirectory() + "/" + i;
      this->Makefile->AddSubDirectory(srcPath, binPath, excludeFromAll, false);
    }
    // otherwise it is a full path
    else if (cmSystemTools::FileIsDirectory(i)) {
      // we must compute the binPath from the srcPath, we just take the last
      // element from the source path and use that
      std::string binPath = this->Makefile->GetCurrentBinaryDirectory() + "/" +
        cmSystemTools::GetFilenameName(i);
      this->Makefile->AddSubDirectory(i, binPath, excludeFromAll, false);
    } else {
      std::string error = "Incorrect SUBDIRS command. Directory: ";
      error += i + " does not exist.";
      this->SetError(error);
      res = false;
    }
  }
  return res;
}